

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O1

void abi_test::internal::CheckGTest<void,P256_POINT*,P256_POINT_const*,P256_POINT_AFFINE_const*>
               (char *va_args_str,char *file,int line,bool unwind,
               _func_void_P256_POINT_ptr_P256_POINT_ptr_P256_POINT_AFFINE_ptr *func,Type args,
               Type args_1,Type args_2)

{
  pointer pbVar1;
  pointer pbVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  pointer pbVar4;
  char *str;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  Message msg;
  Result result;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 local_68 [32];
  Result local_48;
  
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._8_8_ = args_1;
  local_68._16_8_ = args_2;
  local_68._24_8_ = 0;
  local_68._0_8_ = args;
  RunTrampoline(&local_48,(crypto_word_t)func,(crypto_word_t *)local_68,3,unwind);
  if (local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"ABI failures in ",0x10);
    FixVAArgsString_abi_cxx11_((string *)local_68,(internal *)va_args_str,str);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),(char *)local_68._0_8_,local_68._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),":\n",2);
    pbVar1 = local_48.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = local_48.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((Type)local_68._0_8_ != (Type)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
      pbVar1 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pbVar4 = local_48.errors.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pbVar1 != local_48.errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_78._M_head_impl + 0x10),"    ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_78._M_head_impl + 0x10),(pbVar1->_M_dataplus)._M_p,
                 pbVar1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_78._M_head_impl + 0x10),"\n",1);
      pbVar2 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    local_48.errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    testing::Message::Message((Message *)&local_70);
    _Var3._M_head_impl = local_70._M_head_impl;
    testing::Message::GetString_abi_cxx11_((string *)local_68,(Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(_Var3._M_head_impl + 0x10),(char *)local_68._0_8_,local_68._8_8_);
    if ((Type)local_68._0_8_ != (Type)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,file,line,"Failed");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.errors);
  return;
}

Assistant:

inline R CheckGTest(const char *va_args_str, const char *file, int line,
                    bool unwind, R (*func)(Args...),
                    typename DeductionGuard<Args>::Type... args) {
  Result result;
  crypto_word_t ret = CheckImpl(&result, unwind, func, args...);
  if (!result.ok()) {
    testing::Message msg;
    msg << "ABI failures in " << FixVAArgsString(va_args_str) << ":\n";
    for (const auto &error : result.errors) {
      msg << "    " << error << "\n";
    }
    ADD_FAILURE_AT(file, line) << msg;
  }
  return (R)ret;
}